

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<Header>::emplace<Header>
          (QGenericArrayOps<Header> *this,qsizetype i,Header *args)

{
  Header **ppHVar1;
  qsizetype *pqVar2;
  __index_type _Var3;
  Data *pDVar4;
  long lVar5;
  Header *pHVar6;
  Data *pDVar7;
  char *pcVar8;
  qsizetype qVar9;
  QArrayData *pQVar10;
  undefined1 *puVar11;
  long in_FS_OFFSET;
  bool bVar12;
  Inserter local_c8;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_78;
  __index_type _Stack_60;
  undefined3 uStack_5f;
  undefined4 uStack_5c;
  QArrayData *local_58;
  char *pcStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<Header>).d;
  if ((pDVar4 == (Data *)0x0) ||
     (1 < (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00192a84:
    local_c8.data = (QArrayDataPointer<Header> *)&local_78;
    local_78._16_4_ = 0xaaaaaaaa;
    local_78._20_4_ = 0xaaaaaaaa;
    uStack_5c = 0xaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._M_first._M_storage = (_Uninitialized<QHttpHeaders::WellKnownHeader,_true>)0xaaaaaaaa;
    local_78._4_4_ = 0xaaaaaaaa;
    local_78._8_4_ = 0xaaaaaaaa;
    local_78._12_4_ = 0xaaaaaaaa;
    _Var3 = *(__index_type *)
             ((long)&(args->name).data.
                     super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                     super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
    __Stack_60 = CONCAT31(0xaaaaaa,_Var3);
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
      ::_S_vtable._M_arr[(long)(char)_Var3 + 1]._M_data)
              ((anon_class_8_1_a78179b7_conflict *)&local_c8,
               (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)args);
    local_58 = &((args->value).d.d)->super_QArrayData;
    pcStack_50 = (args->value).d.ptr;
    (args->value).d.d = (Data *)0x0;
    (args->value).d.ptr = (char *)0x0;
    local_48 = (undefined1 *)(args->value).d.size;
    (args->value).d.size = 0;
    bVar12 = (this->super_QArrayDataPointer<Header>).size != 0;
    QArrayDataPointer<Header>::detachAndGrow
              (&this->super_QArrayDataPointer<Header>,(uint)(i == 0 && bVar12),1,(Header **)0x0,
               (QArrayDataPointer<Header> *)0x0);
    if (i == 0 && bVar12) {
      pHVar6 = (this->super_QArrayDataPointer<Header>).ptr;
      local_c8.data = (QArrayDataPointer<Header> *)(pHVar6 + -1);
      *(__index_type *)
       ((long)&pHVar6[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      *(__index_type *)
       ((long)&pHVar6[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = _Stack_60
      ;
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr[(long)(char)_Stack_60 + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_c8,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_78);
      puVar11 = local_48;
      pcVar8 = pcStack_50;
      pQVar10 = local_58;
      local_58 = (QArrayData *)0x0;
      pHVar6[-1].value.d.d = (Data *)pQVar10;
      pcStack_50 = (char *)0x0;
      pHVar6[-1].value.d.ptr = pcVar8;
      local_48 = (undefined1 *)0x0;
      pHVar6[-1].value.d.size = (qsizetype)puVar11;
      ppHVar1 = &(this->super_QArrayDataPointer<Header>).ptr;
      *ppHVar1 = *ppHVar1 + -1;
      pqVar2 = &(this->super_QArrayDataPointer<Header>).size;
      *pqVar2 = *pqVar2 + 1;
    }
    else {
      local_c8.sourceCopyConstruct = 0;
      local_c8.nSource = 0;
      local_c8.move = 0;
      local_c8.sourceCopyAssign = 0;
      local_c8.end = (Header *)0x0;
      local_c8.last = (Header *)0x0;
      local_c8.where = (Header *)0x0;
      local_c8.begin = (this->super_QArrayDataPointer<Header>).ptr;
      local_c8.size = (this->super_QArrayDataPointer<Header>).size;
      local_c8.data = &this->super_QArrayDataPointer<Header>;
      Inserter::insertOne(&local_c8,i,(Header *)&local_78._M_first);
      *(Header **)
       ((long)&(((HeaderName *)&(local_c8.data)->d)->data).
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 8) =
           local_c8.begin;
      *(qsizetype *)
       ((long)&(((HeaderName *)&(local_c8.data)->d)->data).
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x10) =
           local_c8.size;
    }
    if (local_58 != (QArrayData *)0x0) {
      LOCK();
      (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_58,1,0x10);
      }
    }
    if ((long)(char)_Stack_60 != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr[(char)_Stack_60]._M_data)
                ((anon_class_1_0_00000001 *)&local_c8,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_78);
      __Stack_60 = CONCAT31(uStack_5f,0xff);
    }
  }
  else {
    lVar5 = (this->super_QArrayDataPointer<Header>).size;
    if ((lVar5 == i && pDVar4 != (Data *)0x0) &&
       ((pDVar4->super_QArrayData).alloc - lVar5 !=
        ((long)((long)(this->super_QArrayDataPointer<Header>).ptr -
               ((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        0x6db6db6db6db6db7)) {
      pHVar6 = (this->super_QArrayDataPointer<Header>).ptr;
      local_c8.data = (QArrayDataPointer<Header> *)(pHVar6 + lVar5);
      *(__index_type *)
       ((long)&pHVar6[lVar5].name.data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      *(__index_type *)
       ((long)&pHVar6[lVar5].name.data.
               super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) =
           *(__index_type *)
            ((long)&(args->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>
                    .super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(args->name).data.
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                      0x18) + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_c8,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)args);
      pDVar7 = (args->value).d.d;
      (args->value).d.d = (Data *)0x0;
      pHVar6[lVar5].value.d.d = pDVar7;
      pcVar8 = (args->value).d.ptr;
      (args->value).d.ptr = (char *)0x0;
      pHVar6[lVar5].value.d.ptr = pcVar8;
      qVar9 = (args->value).d.size;
      (args->value).d.size = 0;
      pHVar6[lVar5].value.d.size = qVar9;
    }
    else {
      if (((i != 0) || (pDVar4 == (Data *)0x0)) ||
         ((Header *)((ulong)((long)&pDVar4[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) ==
          (this->super_QArrayDataPointer<Header>).ptr)) goto LAB_00192a84;
      pHVar6 = (this->super_QArrayDataPointer<Header>).ptr;
      local_c8.data = (QArrayDataPointer<Header> *)(pHVar6 + -1);
      *(__index_type *)
       ((long)&pHVar6[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) = 0xff;
      *(__index_type *)
       ((long)&pHVar6[-1].name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
               super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18) =
           *(__index_type *)
            ((long)&(args->name).data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>
                    .super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                    super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> + 0x18);
      (*std::__detail::__variant::
        __gen_vtable<std::__detail::__variant::__variant_cookie,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:500:30)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&&>
        ::_S_vtable._M_arr
        [(long)(char)*(__index_type *)
                      ((long)&(args->name).data.
                              super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
                              super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray> +
                      0x18) + 1]._M_data)
                ((anon_class_8_1_a78179b7_conflict *)&local_c8,
                 (variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)args);
      pDVar7 = (args->value).d.d;
      (args->value).d.d = (Data *)0x0;
      pHVar6[-1].value.d.d = pDVar7;
      pcVar8 = (args->value).d.ptr;
      (args->value).d.ptr = (char *)0x0;
      pHVar6[-1].value.d.ptr = pcVar8;
      qVar9 = (args->value).d.size;
      (args->value).d.size = 0;
      pHVar6[-1].value.d.size = qVar9;
      ppHVar1 = &(this->super_QArrayDataPointer<Header>).ptr;
      *ppHVar1 = *ppHVar1 + -1;
    }
    pqVar2 = &(this->super_QArrayDataPointer<Header>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }